

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

secp256k1_context * secp256k1_context_create(uint flags)

{
  long *__src;
  secp256k1_context *prealloc;
  secp256k1_context *psVar1;
  secp256k1_context *in_RSI;
  
  __src = (long *)secp256k1_context_preallocated_size(flags);
  prealloc = (secp256k1_context *)malloc((size_t)__src);
  if (prealloc != (secp256k1_context *)0x0) {
    psVar1 = secp256k1_context_preallocated_create(prealloc,flags);
    if (psVar1 == (secp256k1_context *)0x0) {
      free(prealloc);
      prealloc = (secp256k1_context *)0x0;
    }
    return prealloc;
  }
  secp256k1_context_create_cold_1();
  if (in_RSI == (secp256k1_context *)0x0) {
    secp256k1_context_preallocated_clone_cold_1();
    in_RSI = (secp256k1_context *)0x0;
  }
  else {
    memcpy(in_RSI,__src,(ulong)(*__src != 0) << 0x14 | 0xe0);
    if (*__src != 0) {
      (in_RSI->ecmult_ctx).pre_g =
           (secp256k1_ge_storage_0_ *)((*__src - (long)__src) + (long)in_RSI);
    }
    if (__src[1] != 0) {
      (in_RSI->ecmult_ctx).pre_g_128 =
           (secp256k1_ge_storage_0_ *)((__src[1] - (long)__src) + (long)in_RSI);
    }
  }
  return in_RSI;
}

Assistant:

secp256k1_context* secp256k1_context_create(unsigned int flags) {
    size_t const prealloc_size = secp256k1_context_preallocated_size(flags);
    secp256k1_context* ctx = (secp256k1_context*)checked_malloc(&default_error_callback, prealloc_size);
    if (EXPECT(secp256k1_context_preallocated_create(ctx, flags) == NULL, 0)) {
        free(ctx);
        return NULL;
    }

    return ctx;
}